

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O2

void __thiscall clunk::Node::Undo<true>(Node *this,Move *move)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  byte bVar10;
  uint type;
  ulong uVar11;
  uint to;
  uint type_00;
  int iStack_50;
  ulong uVar12;
  
  if ((this->state & 1) == 0) {
    __assert_fail("COLOR(state) == color",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xae7,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  bVar5 = Move::IsValid(move);
  if (!bVar5) {
    __assert_fail("move.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xae8,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  uVar7 = move->bits;
  if ((uVar7 & 0x88000) != 0) {
    __assert_fail("IS_SQUARE(move.From())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xae9,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  if ((uVar7 & 0x880) != 0) {
    __assert_fail("IS_SQUARE(move.To())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xaea,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  pbVar2 = (byte *)(&_board)[uVar7 >> 0xc & 0xff];
  if (pbVar2 != _EMPTY) {
    __assert_fail("_board[move.From()] == _EMPTY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xaeb,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  uVar9 = uVar7 >> 0x14 & 0xf;
  if (uVar9 != 0) {
    if ((uVar9 == 1) || (0xb < uVar9)) {
      __assert_fail("!move.Cap() || IS_CAP(move.Cap())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xaec,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if ((uVar7 >> 0x14 & 1) != 0) {
      __assert_fail("!move.Cap() || (COLOR(move.Cap()) != color)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xaed,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
  }
  uVar9 = uVar7 >> 0x18 & 0xf;
  if (uVar9 != 0) {
    if (7 < uVar9 - 4) {
      __assert_fail("!move.Promo() || IS_PROMO(move.Promo())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xaee,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if ((uVar7 >> 0x18 & 1) == 0) {
      __assert_fail("!move.Promo() || (COLOR(move.Promo()) == color)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xaef,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
  }
  _seenIndex = (-(uint)(_seenIndex != 0) | 99) + _seenIndex;
  if (99 < _seenIndex) {
    __assert_fail("(_seenIndex >= 0) & (_seenIndex < MaxPlies)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xaf2,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  uVar7 = (uint)this->positionKey & 0x3fff;
  if (_seenFilter[uVar7] == '\0') {
    __assert_fail("_seenFilter[positionKey & SeenFilterMask]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xaf3,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  _seenFilter[uVar7] = _seenFilter[uVar7] + -1;
  if (_seenStackTop < (undefined *)((long)&_seenStack + 1U)) {
    __assert_fail("_seenStackTop > _seenStack",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xaf7,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  _seenStackTop = _seenStackTop + -8;
  uVar7 = move->bits;
  uVar9 = uVar7 >> 4 & 0xff;
  uVar11 = (ulong)uVar9;
  pbVar3 = (byte *)(&_board)[uVar11];
  if ((pbVar3 == (byte *)0x0) || (pbVar3 == pbVar2)) {
    __assert_fail("moved && (moved != _EMPTY)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xb01,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  bVar1 = *pbVar3;
  if (bVar1 == 0) {
    __assert_fail("moved->type",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xb02,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  if ((bVar1 & 1) == 0) {
    __assert_fail("COLOR(moved->type) == color",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xb03,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  if (pbVar3[1] != (byte)(uVar7 >> 4)) {
    __assert_fail("moved->sqr == to",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xb04,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  to = uVar7 >> 0xc & 0xff;
  uVar12 = (ulong)to;
  type = uVar7 >> 0x14 & 0xf;
  type_00 = uVar7 >> 0x18 & 0xf;
  uVar8 = uVar7 & 0xf;
  if (uVar8 == 0xe) {
    if (pbVar3 != PTR_DAT_00158348) {
      __assert_fail("moved == (color ? _KING[Black] : _KING[White])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb77,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (to != 0x74) {
      __assert_fail("from == (color ? E8 : E1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb78,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (uVar9 != 0x72) {
      __assert_fail("to == (color ? C8 : C1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb79,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (type != 0) {
      __assert_fail("!cap",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb7a,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (type_00 != 0) {
      __assert_fail("!promo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb7b,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (DAT_001647c0 != pbVar2) {
      __assert_fail("_board[color ? E8 : E1] == _EMPTY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb7c,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (DAT_001647a0 != pbVar2) {
      __assert_fail("_board[color ? A8 : A1] == _EMPTY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb7d,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (DAT_001647a8 != pbVar2) {
      __assert_fail("_board[color ? B8 : B1] == _EMPTY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb7e,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (DAT_001647b0 == pbVar2) {
      __assert_fail("_board[color ? C8 : C1] != _EMPTY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb7f,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (DAT_001647b8 == pbVar2) {
      __assert_fail("_board[color ? D8 : D1] != _EMPTY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb80,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (*DAT_001647b8 != 9) {
      __assert_fail("_board[color ? D8 : D1]->type == (color|Rook)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb81,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    ClearKingDirs<true>(0x72);
    ClearAttacksFrom(9,0x73);
    pbVar2 = DAT_001647b8;
    DAT_001647a0 = DAT_001647b8;
    DAT_001647b8 = _EMPTY;
    DAT_001647b0 = _EMPTY;
    DAT_001647c0 = pbVar3;
    pbVar3[1] = 0x74;
    pbVar2[1] = 0x70;
    SetKingDirs<true>(0x74);
    if (_kingDir[0x7c] == '\x01') {
      if (_kingDir[0x7b] != '\x01') {
        __assert_fail("_kingDir[color ? (D8 + 8) : D1] == East",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xb8c,"void clunk::Node::Undo(const Move &) const [color = true]");
      }
      _kingDir[0x7b] = '\0';
    }
    if (_atk._928_8_ != 0) {
      TruncateAttacks(0x74,0x72);
    }
    iStack_50 = 0x70;
LAB_0012afc1:
    AddAttacksFrom(9,iStack_50);
    return;
  }
  bVar10 = (byte)(uVar7 >> 0xc);
  if (uVar8 == 0xc) {
    ClearKingDirs<true>(uVar9);
    (&_board)[uVar12] = pbVar3;
    pbVar3[1] = bVar10;
    if (type == 0) {
      (&_board)[uVar11] = _EMPTY;
    }
    else {
      AddPiece(type,uVar9);
      iVar6 = ValueOf(type);
      _material = _material + iVar6;
    }
    if (*(long *)(_atk + uVar12 * 8) != 0) {
      TruncateAttacks(to,uVar9);
    }
    if (type < 6) {
      if ((type == 0) && (*(long *)(_atk + uVar11 * 8) != 0)) {
        ExtendAttacks(uVar9);
      }
    }
    else {
      AddAttacksFrom(type,uVar9);
    }
    SetKingDirs<true>(to);
    UpdateKingDirs<false>(uVar9,to);
    return;
  }
  if (uVar8 == 0xd) {
    if (pbVar3 != PTR_DAT_00158348) {
      __assert_fail("moved == (color ? _KING[Black] : _KING[White])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb5a,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (to != 0x74) {
      __assert_fail("from == (color ? E8 : E1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb5b,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (uVar9 != 0x76) {
      __assert_fail("to == (color ? G8 : G1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb5c,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (type != 0) {
      __assert_fail("!cap",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb5d,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (type_00 != 0) {
      __assert_fail("!promo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb5e,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (DAT_001647c0 != pbVar2) {
      __assert_fail("_board[color ? E8 : E1] == _EMPTY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb5f,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (DAT_001647d8 != pbVar2) {
      __assert_fail("_board[color ? H8 : H1] == _EMPTY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb60,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (DAT_001647c8 == pbVar2) {
      __assert_fail("_board[color ? F8 : F1] != _EMPTY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb61,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (DAT_001647d0 == pbVar2) {
      __assert_fail("_board[color ? G8 : G1] != _EMPTY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb62,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (*DAT_001647c8 != 9) {
      __assert_fail("_board[color ? F8 : F1]->type == (color|Rook)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb63,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    ClearKingDirs<true>(0x76);
    ClearAttacksFrom(9,0x75);
    pbVar2 = DAT_001647c8;
    DAT_001647d0 = _EMPTY;
    DAT_001647d8 = DAT_001647c8;
    DAT_001647c8 = _EMPTY;
    DAT_001647c0 = pbVar3;
    pbVar3[1] = 0x74;
    pbVar2[1] = 0x77;
    SetKingDirs<true>(0x74);
    if (_kingDir[0x7c] == -1) {
      if (_kingDir[0x7d] != -1) {
        __assert_fail("_kingDir[color ? (F8 + 8) : F1] == West",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xb6e,"void clunk::Node::Undo(const Move &) const [color = true]");
      }
      _kingDir[0x7d] = '\0';
    }
    if (_atk._928_8_ != 0) {
      TruncateAttacks(0x74,0x76);
    }
    iStack_50 = 0x77;
    goto LAB_0012afc1;
  }
  uVar7 = (uint)bVar1;
  if (uVar8 != 3) {
    if (_FIRST_SLIDER <= pbVar3) {
      ClearAttacksFrom(uVar7,uVar9);
    }
    if (type_00 == 0) {
      (&_board)[uVar12] = pbVar3;
      pbVar3[1] = bVar10;
    }
    else {
      if ((move->bits & 0xf) != 1) {
        __assert_fail("move.Type() == PawnMove",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xb99,"void clunk::Node::Undo(const Move &) const [color = true]");
      }
      if (type_00 != *pbVar3) {
        __assert_fail("moved->type == promo",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xb9a,"void clunk::Node::Undo(const Move &) const [color = true]");
      }
      RemovePiece(type_00,uVar9);
      AddPiece(3,to);
      iVar6 = ValueOf(type_00);
      DAT_00164924 = (DAT_00164924 - iVar6) + 100;
    }
    if (type == 0) {
      (&_board)[uVar11] = _EMPTY;
    }
    else {
      AddPiece(type,uVar9);
      iVar6 = ValueOf(type);
      _material = _material + iVar6;
    }
    if (*(long *)(_atk + uVar12 * 8) != 0) {
      TruncateAttacks(to,uVar9);
    }
    if (type < 6) {
      if ((type == 0) && (*(long *)(_atk + uVar11 * 8) != 0)) {
        ExtendAttacks(uVar9);
      }
    }
    else {
      AddAttacksFrom(type,uVar9);
    }
    if (_FIRST_SLIDER <= (byte *)(&_board)[uVar12]) {
      AddAttacksFrom((uint)*(byte *)(&_board)[uVar12],to);
    }
    UpdateKingDirs<false>(uVar9,to);
    goto LAB_0012b2a9;
  }
  if (type_00 == 0) {
    if (type != 0) {
      *(byte **)((long)&_board + (ulong)(to * 8)) = pbVar3;
      pbVar3[1] = bVar10;
      AddPiece(type,uVar9);
      iVar6 = ValueOf(type);
      _material = _material + iVar6;
      lVar4 = *(long *)(_atk + to * 8);
      goto joined_r0x0012b108;
    }
    if (uVar7 != 3) {
      __assert_fail("moved->type == (color|Pawn)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb27,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if ((this->ep == 0x78) || (uVar9 != this->ep)) {
      __assert_fail("(ep != None) && (to == ep)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb28,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    uVar7 = uVar9 + 0x10;
    uVar12 = (ulong)uVar7;
    if ((byte *)(&_board)[uVar12] != pbVar2) {
      __assert_fail("_board[sqr] == _EMPTY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb2a,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (*(long *)(_atk + uVar12 * 8) != 0) {
      TruncateAttacks(uVar7,-1);
    }
    AddPiece(2,uVar7);
    (&_board)[uVar11] = _EMPTY;
    *(byte **)((long)&_board + (ulong)(to * 8)) = pbVar3;
    pbVar3[1] = bVar10;
    _material = _material + 100;
    if (*(long *)(_atk + to * 8) != 0) {
      TruncateAttacks(to,uVar9);
    }
    if (*(long *)(_atk + uVar11 * 8) != 0) {
      ExtendAttacks(uVar9);
    }
    if (*(long *)(_atk + uVar12 * 8) != 0) {
      TruncateAttacks(uVar7,to);
    }
    UpdateKingDirs<false>(uVar9,uVar7);
    UpdateKingDirs<true>(uVar9,uVar7);
  }
  else {
    if (type_00 != uVar7) {
      __assert_fail("moved->type == promo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb09,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (type == 0) {
      __assert_fail("cap",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb0a,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (5 < type_00) {
      ClearAttacksFrom(type_00,uVar9);
    }
    RemovePiece(type_00,uVar9);
    AddPiece(type,uVar9);
    AddPiece(3,to);
    iVar6 = ValueOf(type_00);
    DAT_00164924 = (DAT_00164924 - iVar6) + 100;
    iVar6 = ValueOf(type);
    _material = _material + iVar6;
    lVar4 = *(long *)(_atk + uVar12 * 8);
joined_r0x0012b108:
    if (lVar4 != 0) {
      TruncateAttacks(to,uVar9);
    }
    if (5 < type) {
      AddAttacksFrom(type,uVar9);
    }
  }
  UpdateKingDirs<false>(uVar9,to);
LAB_0012b2a9:
  UpdateKingDirs<true>(uVar9,to);
  return;
}

Assistant:

void Undo(const Move& move) const {
    assert(COLOR(state) == color);
    assert(move.IsValid());
    assert(IS_SQUARE(move.From()));
    assert(IS_SQUARE(move.To()));
    assert(_board[move.From()] == _EMPTY);
    assert(!move.Cap() || IS_CAP(move.Cap()));
    assert(!move.Cap() || (COLOR(move.Cap()) != color));
    assert(!move.Promo() || IS_PROMO(move.Promo()));
    assert(!move.Promo() || (COLOR(move.Promo()) == color));

    _seenIndex += ((MaxPlies * !_seenIndex) - 1);
    assert((_seenIndex >= 0) & (_seenIndex < MaxPlies));
    assert(_seenFilter[positionKey & SeenFilterMask]);
    _seenFilter[positionKey & SeenFilterMask]--;

#ifndef NDEBUG
    assert(_seenStackTop > _seenStack);
    _seenStackTop--;
#endif

    const int from  = move.From();
    const int to    = move.To();
    const int cap   = move.Cap();
    const int promo = move.Promo();

    Piece* moved = _board[to];
    assert(moved && (moved != _EMPTY));
    assert(moved->type);
    assert(COLOR(moved->type) == color);
    assert(moved->sqr == to);

    switch (move.Type()) {
    case PawnCap:
      if (promo) {
        assert(moved->type == promo);
        assert(cap);
        if (promo >= Bishop) {
          ClearAttacksFrom(promo, to);
        }
        RemovePiece(promo, to);
        AddPiece(cap, to);
        AddPiece((color|Pawn), from);
        _material[color] += (PawnValue - ValueOf(promo));
        _material[!color] += ValueOf(cap);
        if (_atk[from]) {
          TruncateAttacks(from, to);
        }
        if (cap >= Bishop) {
          AddAttacksFrom(cap, to);
        }
      }
      else if (cap) {
        _board[from] = moved;
        moved->sqr = from;
        AddPiece(cap, to);
        _material[!color] += ValueOf(cap);
        if (_atk[from]) {
          TruncateAttacks(from, to);
        }
        if (cap >= Bishop) {
          AddAttacksFrom(cap, to);
        }
      }
      else {
        assert(moved->type == (color|Pawn));
        assert((ep != None) && (to == ep));
        const int sqr = (ep + (color ? North : South));
        assert(_board[sqr] == _EMPTY);
        if (_atk[sqr]) {
          TruncateAttacks(sqr, -1);
        }
        AddPiece(((!color)|Pawn), sqr);
        _board[to] = _EMPTY;
        _board[from] = moved;
        moved->sqr = from;
        _material[!color] += PawnValue;
        if (_atk[from]) {
          TruncateAttacks(from, to);
        }
        if (_atk[to]) {
          ExtendAttacks(to);
        }
        if (_atk[sqr]) {
          TruncateAttacks(sqr, from);
        }
        UpdateKingDirs<White>(to, sqr);
        UpdateKingDirs<Black>(to, sqr);
      }
      UpdateKingDirs<White>(to, from);
      UpdateKingDirs<Black>(to, from);
      break;
    case KingMove:
      ClearKingDirs<color>(to);
      _board[from] = moved;
      moved->sqr = from;
      if (cap) {
        AddPiece(cap, to);
        _material[!color] += ValueOf(cap);
      }
      else {
        _board[to] = _EMPTY;
      }
      if (_atk[from]) {
        TruncateAttacks(from, to);
      }
      if (cap >= Bishop) {
        AddAttacksFrom(cap, to);
      }
      else if (!cap && _atk[to]) {
        ExtendAttacks(to);
      }
      SetKingDirs<color>(from);
      UpdateKingDirs<!color>(to, from);
      break;
    case CastleShort:
      assert(moved == (color ? _KING[Black] : _KING[White]));
      assert(from == (color ? E8 : E1));
      assert(to == (color ? G8 : G1));
      assert(!cap);
      assert(!promo);
      assert(_board[color ? E8 : E1] == _EMPTY);
      assert(_board[color ? H8 : H1] == _EMPTY);
      assert(_board[color ? F8 : F1] != _EMPTY);
      assert(_board[color ? G8 : G1] != _EMPTY);
      assert(_board[color ? F8 : F1]->type == (color|Rook));
      ClearKingDirs<color>(to);
      ClearAttacksFrom((color|Rook), (color ? F8 : F1));
      _board[color ? E8 : E1] = moved;
      _board[color ? G8 : G1] = _EMPTY;
      _board[color ? H8 : H1] = _board[color ? F8 : F1];
      _board[color ? F8 : F1] = _EMPTY;
      moved->sqr = from;
      _board[color ? H8 : H1]->sqr = (color ? H8 : H1);
      SetKingDirs<color>(from);
      if (_kingDir[color ? (E8 + 8) : E1] == West) {
        assert(_kingDir[color ? (F8 + 8) : F1] == West);
        _kingDir[color ? (F8 + 8) : F1] = 0;
      }
      if (_atk[from]) {
        TruncateAttacks(from, to);
      }
      AddAttacksFrom((color|Rook), (color ? H8 : H1));
      break;
    case CastleLong:
      assert(moved == (color ? _KING[Black] : _KING[White]));
      assert(from == (color ? E8 : E1));
      assert(to == (color ? C8 : C1));
      assert(!cap);
      assert(!promo);
      assert(_board[color ? E8 : E1] == _EMPTY);
      assert(_board[color ? A8 : A1] == _EMPTY);
      assert(_board[color ? B8 : B1] == _EMPTY);
      assert(_board[color ? C8 : C1] != _EMPTY);
      assert(_board[color ? D8 : D1] != _EMPTY);
      assert(_board[color ? D8 : D1]->type == (color|Rook));
      ClearKingDirs<color>(to);
      ClearAttacksFrom((color|Rook), (color ? D8 : D1));
      _board[color ? A8 : A1] = _board[color ? D8 : D1];
      _board[color ? D8 : D1] = _EMPTY;
      _board[color ? E8 : E1] = moved;
      _board[color ? C8 : C1] = _EMPTY;
      moved->sqr = from;
      _board[color ? A8 : A1]->sqr = (color ? A8 : A1);
      SetKingDirs<color>(from);
      if (_kingDir[color ? (E8 + 8) : E1] == East) {
        assert(_kingDir[color ? (D8 + 8) : D1] == East);
        _kingDir[color ? (D8 + 8) : D1] = 0;
      }
      if (_atk[from]) {
        TruncateAttacks(from, to);
      }
      AddAttacksFrom((color|Rook), (color ? A8 : A1));
      break;
    default:
      if (moved >= _FIRST_SLIDER) {
        ClearAttacksFrom(moved->type, to);
      }
      if (promo) {
        assert(move.Type() == PawnMove);
        assert(moved->type == promo);
        RemovePiece(promo, to);
        AddPiece((color|Pawn), from);
        _material[color] += (PawnValue - ValueOf(promo));
      }
      else {
        _board[from] = moved;
        moved->sqr = from;
      }
      if (cap) {
        AddPiece(cap, to);
        _material[!color] += ValueOf(cap);
      }
      else {
        _board[to] = _EMPTY;
      }
      if (_atk[from]) {
        TruncateAttacks(from, to);
      }
      if (cap >= Bishop) {
        AddAttacksFrom(cap, to);
      }
      else if (!cap && _atk[to]) {
        ExtendAttacks(to);
      }
      if (_board[from] >= _FIRST_SLIDER) {
        AddAttacksFrom(_board[from]->type, from);
      }
      UpdateKingDirs<White>(to, from);
      UpdateKingDirs<Black>(to, from);
    }

#if 0
    assert(VerifyAttacks(true));
#endif
  }